

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayref.h
# Opt level: O0

void __thiscall
mp::ArrayRef<double>::init_from_rvalue<mp::ArrayRef<double>>
          (ArrayRef<double> *this,ArrayRef<double> *other)

{
  size_type sVar1;
  double *pdVar2;
  pointer pdVar3;
  ArrayRef<double> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  
  sVar1 = std::vector<double,_std::allocator<double>_>::size(&in_RSI->save_);
  if (sVar1 == 0) {
    pdVar2 = data(in_RSI);
    in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar2;
    pdVar3 = (pointer)size(in_RSI);
    in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  else {
    std::vector<double,_std::allocator<double>_>::operator=(&in_RSI->save_,in_RDI);
    pdVar2 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x298df1);
    in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar2;
    pdVar3 = (pointer)std::vector<double,_std::allocator<double>_>::size(in_RDI);
    in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  return;
}

Assistant:

void init_from_rvalue(AR&& other) noexcept {
      if (other.save_.size()) {
        save_ = std::move(other.save_);
        data_ = save_.data();
        size_ = save_.size();
      }
      else {
        data_ = other.data();
        size_ = other.size();
      }
    }